

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

void __thiscall Analyser::analyse_multiplicative_expression(Analyser *this)

{
  ulong uVar1;
  pointer pTVar2;
  optional<Token> next;
  _Storage<Token,_false> local_68;
  byte local_48;
  _Storage<Token,_false> local_40;
  char local_20;
  
  analyse_unary_expression(this);
  nextToken((optional<Token> *)&local_68._M_value,this);
  if (local_48 == 1) {
    do {
      if (local_68._M_value._type == MULTIPLICATION_SIGN) {
        analyse_unary_expression(this);
        local_40._0_8_ = 3;
        local_40._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        addInstruction(this,(Instruction *)&local_40._M_value);
      }
      else {
        if (local_68._M_value._type != DIVISION_SIGN) {
          uVar1 = this->_offset;
          if (uVar1 != 0) {
            pTVar2 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (uVar1 < (ulong)((long)(this->_tokens).
                                      super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pTVar2 >> 5)) {
              this->_currentLine = (int32_t)pTVar2[uVar1 - 1]._lineNumber;
            }
            this->_offset = uVar1 - 1;
          }
          if ((local_48 & 1) == 0) {
            return;
          }
          std::_Optional_payload_base<Token>::_M_destroy
                    ((_Optional_payload_base<Token> *)&local_68._M_value);
          return;
        }
        analyse_unary_expression(this);
        local_40._0_8_ = 4;
        local_40._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        addInstruction(this,(Instruction *)&local_40._M_value);
      }
      nextToken((optional<Token> *)&local_40._M_value,this);
      std::_Optional_payload_base<Token>::_M_move_assign
                ((_Optional_payload_base<Token> *)&local_68._M_value,
                 (_Optional_payload_base<Token> *)&local_40._M_value);
      if (local_20 == '\x01') {
        std::_Optional_payload_base<Token>::_M_destroy
                  ((_Optional_payload_base<Token> *)&local_40._M_value);
      }
    } while (local_48 != 0);
  }
  return;
}

Assistant:

void Analyser::analyse_multiplicative_expression() {
	analyse_unary_expression();
	auto next = nextToken();

	while (next.has_value()) {
		auto type = next.value().GetType();
		switch (type)
		{
		case TokenType::MULTIPLICATION_SIGN:
			analyse_unary_expression();
			addInstruction(Instruction(Operation::imul));
			break;
		case TokenType::DIVISION_SIGN:
			analyse_unary_expression();
			addInstruction(Instruction(Operation::idiv));
			break;
		default:
			unreadToken();
			return;
		}
		next = nextToken();
	}
	return;
}